

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O1

base_learner * nn_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  uint64_t uVar2;
  undefined8 uVar3;
  nn *pnVar4;
  vw *all_00;
  options_i *options_00;
  int iVar5;
  option_group_definition *poVar6;
  loss_function *plVar7;
  float *pfVar8;
  bool *pbVar9;
  polyprediction *ppVar10;
  base_learner *l;
  single_learner *base;
  learner<nn,_example> *plVar11;
  char *pcVar12;
  bool meanfield;
  free_ptr<nn> n;
  option_group_definition new_options;
  bool local_529;
  code *local_528;
  nn *local_520;
  vw *local_518;
  options_i *local_510;
  string local_508;
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  string local_4c8;
  undefined1 *local_4a8 [2];
  undefined1 local_498 [16];
  string local_488;
  undefined1 *local_468;
  long local_460;
  undefined1 local_458 [16];
  option_group_definition local_448;
  string local_410;
  undefined1 *local_3f0 [2];
  undefined1 local_3e0 [16];
  string local_3d0;
  undefined1 *local_3b0 [2];
  undefined1 local_3a0 [16];
  string local_390;
  undefined1 *local_370 [2];
  undefined1 local_360 [16];
  undefined1 local_350 [112];
  bool local_2e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  undefined1 local_2b0 [112];
  bool local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [112];
  bool local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  scoped_calloc_or_throw<nn>();
  local_529 = false;
  local_468 = local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"Neural Network","");
  local_448.m_name._M_dataplus._M_p = (pointer)&local_448.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_448,local_468,local_468 + local_460);
  local_448.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_510 = options;
  if (local_468 != local_458) {
    operator_delete(local_468);
  }
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"nn","");
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_350,&local_488,&local_520->k);
  local_2e0 = true;
  local_4a8[0] = local_498;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4a8,"Sigmoidal feedforward network with <k> hidden units","");
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&local_448,(typed_option<unsigned_int> *)local_350);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"inpass","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_170,&local_4c8,&local_520->inpass);
  local_100 = true;
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4e8,
             "Train or test sigmoidal feedforward network with input passthrough.","");
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar6,(typed_option<bool> *)local_170);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"multitask","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_210,&local_508,&local_520->multitask);
  local_1a0 = true;
  local_370[0] = local_360;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_370,"Share hidden layer across all reduced tasks.","");
  local_518 = all;
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar6,(typed_option<bool> *)local_210);
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"dropout","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_390,&local_520->dropout);
  local_240 = true;
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3b0,"Train or test sigmoidal feedforward network using dropout.","");
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar6,(typed_option<bool> *)local_2b0);
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"meanfield","");
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_d0,&local_3d0,&local_529)
  ;
  local_3f0[0] = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f0,"Train or test sigmoidal feedforward network using mean field.","")
  ;
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar6,(typed_option<bool> *)local_d0);
  if (local_3f0[0] != local_3e0) {
    operator_delete(local_3f0[0]);
  }
  local_d0._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if (local_3b0[0] != local_3a0) {
    operator_delete(local_3b0[0]);
  }
  local_2b0._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  all_00 = local_518;
  if (local_370[0] != local_360) {
    operator_delete(local_370[0]);
  }
  local_210._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p);
  }
  if (local_4e8[0] != local_4d8) {
    operator_delete(local_4e8[0]);
  }
  local_170._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p);
  }
  if (local_4a8[0] != local_498) {
    operator_delete(local_4a8[0]);
  }
  local_350._0_8_ = &PTR__typed_option_002d50f8;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p);
  }
  options_00 = local_510;
  (**local_510->_vptr_options_i)(local_510,&local_448);
  pp_Var1 = (_func_int **)(local_350 + 0x10);
  local_350._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"nn","");
  iVar5 = (*options_00->_vptr_options_i[1])(options_00,local_350);
  if ((_func_int **)local_350._0_8_ != pp_Var1) {
    operator_delete((void *)local_350._0_8_);
  }
  if ((char)iVar5 == '\0') {
    plVar11 = (learner<nn,_example> *)0x0;
  }
  else {
    local_520->all = all_00;
    if ((local_520->multitask == true) && (all_00->quiet == false)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"using multitask sharing for neural network ",0x2b);
      pcVar12 = "testing";
      if ((ulong)all_00->training != 0) {
        pcVar12 = "training";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,pcVar12,(ulong)all_00->training + 7);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    local_350._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"meanfield","");
    iVar5 = (*options_00->_vptr_options_i[1])(options_00,local_350);
    if ((_func_int **)local_350._0_8_ != pp_Var1) {
      operator_delete((void *)local_350._0_8_);
    }
    if (((char)iVar5 != '\0') && (local_520->dropout = false, all_00->quiet == false)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"using mean field for neural network ",0x24);
      pcVar12 = "testing";
      if ((ulong)all_00->training != 0) {
        pcVar12 = "training";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,pcVar12,(ulong)all_00->training + 7);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    if ((local_520->dropout == true) && (all_00->quiet == false)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"using dropout for neural network ",0x21);
      pcVar12 = "testing";
      if ((ulong)all_00->training != 0) {
        pcVar12 = "training";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,pcVar12,(ulong)all_00->training + 7);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    if ((local_520->inpass == true) && (all_00->quiet == false)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"using input passthrough for neural network ",0x2b);
      pcVar12 = "testing";
      if ((ulong)all_00->training != 0) {
        pcVar12 = "training";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,pcVar12,(ulong)all_00->training + 7);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    local_520->finished_setup = false;
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"squared","");
    plVar7 = getLossFunction(all_00,&local_410,0.0);
    local_520->squared_loss = plVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p);
    }
    uVar2 = all_00->random_seed;
    local_520->xsubi = uVar2;
    local_520->save_xsubi = uVar2;
    pfVar8 = calloc_or_throw<float>((ulong)local_520->k);
    local_520->hidden_units = pfVar8;
    pbVar9 = calloc_or_throw<bool>((ulong)local_520->k);
    local_520->dropped_out = pbVar9;
    ppVar10 = calloc_or_throw<polyprediction>((ulong)local_520->k);
    local_520->hidden_units_pred = ppVar10;
    ppVar10 = calloc_or_throw<polyprediction>((ulong)local_520->k);
    local_520->hiddenbias_pred = ppVar10;
    l = setup_base(options_00,all_00);
    base = LEARNER::as_singleline<char,char>(l);
    pnVar4 = local_520;
    local_520->increment = *(size_t *)(base + 0xe0);
    plVar11 = LEARNER::learner<nn,example>::init_learner<LEARNER::learner<char,example>>
                        (local_520,base,predict_or_learn_multi<true,true>,
                         predict_or_learn_multi<false,true>,(ulong)(local_520->k + 1),
                         *(prediction_type_t *)(base + 0xd0));
    local_520 = (nn *)0x0;
    if (pnVar4->multitask == true) {
      *(code **)(plVar11 + 0x40) = multipredict;
    }
    uVar3 = *(undefined8 *)(plVar11 + 0x18);
    *(undefined8 *)(plVar11 + 0xb8) = uVar3;
    *(undefined8 *)(plVar11 + 0xc0) = *(undefined8 *)(plVar11 + 0x20);
    *(code **)(plVar11 + 200) = finish;
    *(undefined8 *)(plVar11 + 0x58) = uVar3;
    *(code **)(plVar11 + 0x68) = finish_example;
    *(undefined8 *)(plVar11 + 0x88) = uVar3;
    *(undefined8 *)(plVar11 + 0x90) = *(undefined8 *)(plVar11 + 0x20);
    *(code **)(plVar11 + 0x98) = end_pass;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_448.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.m_name._M_dataplus._M_p != &local_448.m_name.field_2) {
    operator_delete(local_448.m_name._M_dataplus._M_p);
  }
  if (local_520 != (nn *)0x0) {
    (*local_528)();
  }
  return (base_learner *)plVar11;
}

Assistant:

base_learner* nn_setup(options_i& options, vw& all)
{
  auto n = scoped_calloc_or_throw<nn>();
  bool meanfield = false;
  option_group_definition new_options("Neural Network");
  new_options.add(make_option("nn", n->k).keep().help("Sigmoidal feedforward network with <k> hidden units"))
      .add(make_option("inpass", n->inpass)
               .keep()
               .help("Train or test sigmoidal feedforward network with input passthrough."))
      .add(make_option("multitask", n->multitask).keep().help("Share hidden layer across all reduced tasks."))
      .add(make_option("dropout", n->dropout).keep().help("Train or test sigmoidal feedforward network using dropout."))
      .add(make_option("meanfield", meanfield).help("Train or test sigmoidal feedforward network using mean field."));
  options.add_and_parse(new_options);

  if (!options.was_supplied("nn"))
    return nullptr;

  n->all = &all;

  if (n->multitask && !all.quiet)
    std::cerr << "using multitask sharing for neural network " << (all.training ? "training" : "testing") << std::endl;

  if (options.was_supplied("meanfield"))
  {
    n->dropout = false;
    if (!all.quiet)
      std::cerr << "using mean field for neural network " << (all.training ? "training" : "testing") << std::endl;
  }

  if (n->dropout && !all.quiet)
    std::cerr << "using dropout for neural network " << (all.training ? "training" : "testing") << std::endl;

  if (n->inpass && !all.quiet)
    std::cerr << "using input passthrough for neural network " << (all.training ? "training" : "testing") << std::endl;

  n->finished_setup = false;
  n->squared_loss = getLossFunction(all, "squared", 0);

  n->xsubi = all.random_seed;

  n->save_xsubi = n->xsubi;

  n->hidden_units = calloc_or_throw<float>(n->k);
  n->dropped_out = calloc_or_throw<bool>(n->k);
  n->hidden_units_pred = calloc_or_throw<polyprediction>(n->k);
  n->hiddenbias_pred = calloc_or_throw<polyprediction>(n->k);

  auto base = as_singleline(setup_base(options, all));
  n->increment = base->increment;  // Indexing of output layer is odd.
  nn& nv = *n.get();
  learner<nn, example>& l =
      init_learner(n, base, predict_or_learn_multi<true, true>, predict_or_learn_multi<false, true>, n->k + 1);
  if (nv.multitask)
    l.set_multipredict(multipredict);
  l.set_finish(finish);
  l.set_finish_example(finish_example);
  l.set_end_pass(end_pass);

  return make_base(l);
}